

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void getEnvmap(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  char *__s1;
  int iVar1;
  Attribute *pAVar2;
  ostream *poVar3;
  invalid_argument *piVar4;
  Envmap type;
  stringstream e;
  allocator<char> local_1dd;
  undefined4 local_1dc;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  int local_198;
  Attribute *local_190;
  
  if (argc + -2 < *i) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Expected an env map");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  __s1 = argv[(long)*i + 1];
  iVar1 = strcmp(__s1,"latlong");
  local_1dc = 0;
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"LATLONG");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"cube");
      local_1dc = 1;
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"CUBE");
        if (iVar1 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),"The value for the ",0x12);
          poVar3 = std::operator<<((ostream *)(local_1b8 + 0x10),attrName);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," attribute must be either LATLONG or CUBE",0x29);
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::invalid_argument::invalid_argument(piVar4,(string *)&local_1d8);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,attrName,&local_1dd);
  pAVar2 = (Attribute *)operator_new(0x10);
  Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::TypedAttribute((Envmap *)pAVar2);
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b8,local_1d8,local_1d0 + (long)local_1d8);
  local_198 = part;
  local_190 = pAVar2;
  std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,(SetAttr *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  *i = *i + 2;
  return;
}

Assistant:

void
getEnvmap (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 2) throw invalid_argument ("Expected an env map");

    char*  str = argv[i + 1];
    Envmap type;

    if (!strcmp (str, "latlong") || !strcmp (str, "LATLONG"))
    {
        type = ENVMAP_LATLONG;
    }
    else if (!strcmp (str, "cube") || !strcmp (str, "CUBE"))
    {
        type = ENVMAP_CUBE;
    }
    else
    {
        std::stringstream e;
        e << "The value for the " << attrName
          << " attribute must be either LATLONG or CUBE";
        throw invalid_argument (e.str ());
    }

    attrs.push_back (SetAttr (attrName, part, new EnvmapAttribute (type)));
    i += 2;
}